

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVector<char,_40UL>::SmallVector(SmallVector<char,_40UL> *this,Base *other)

{
  pointer __src;
  size_t __n;
  size_type sVar1;
  size_type numElems;
  char *__old_val;
  
  (this->super_SmallVectorBase<char>).data_ = (this->super_SmallVectorBase<char>).firstElement;
  (this->super_SmallVectorBase<char>).len = 0;
  (this->super_SmallVectorBase<char>).cap = 0;
  __src = other->data_;
  if (__src == other->firstElement) {
    (this->super_SmallVectorBase<char>).cap = 0x28;
    __n = other->len;
    sVar1 = (this->super_SmallVectorBase<char>).len + __n;
    SmallVectorBase<char>::reserve(&this->super_SmallVectorBase<char>,sVar1);
    if (0 < (long)__n) {
      memmove((this->super_SmallVectorBase<char>).data_ + (this->super_SmallVectorBase<char>).len,
              __src,__n);
    }
    (this->super_SmallVectorBase<char>).len = sVar1;
    other->len = 0;
  }
  else {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<char>).data_ = __src;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<char>).len = sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<char>).cap = sVar1;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }